

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io-util.cc
# Opt level: O2

string * tinyusdz::io::ExpandFilePath
                   (string *__return_storage_ptr__,string *_filepath,void *param_2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  allocator local_c1;
  string s;
  string filepath;
  wordexp_t p;
  string quoted_path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  std::__cxx11::string::string((string *)&filepath,(string *)_filepath);
  if (0x800 < filepath._M_string_length) {
    std::__cxx11::string::resize((ulong)&filepath);
  }
  paVar1 = &s.field_2;
  s._M_string_length = 0;
  s.field_2._M_local_buf[0] = '\0';
  s._M_dataplus._M_p = (pointer)paVar1;
  if (filepath._M_string_length == 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&quoted_path);
  }
  else {
    std::operator+(&local_48,"\"",&filepath);
    std::operator+(&quoted_path,&local_48,"\"");
    std::__cxx11::string::_M_dispose();
    iVar2 = wordexp(quoted_path._M_dataplus._M_p,(wordexp_t *)&p,4);
    if (iVar2 == 0) {
      if (p.we_wordv == (char **)0x0) {
        std::__cxx11::string::_M_assign((string *)&s);
      }
      else {
        std::__cxx11::string::string((string *)&local_48,*p.we_wordv,&local_c1);
        std::__cxx11::string::operator=((string *)&s,(string *)&local_48);
        std::__cxx11::string::_M_dispose();
        wordfree((wordexp_t *)&p);
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    }
    else {
      std::__cxx11::string::_M_assign((string *)&s);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)s._M_dataplus._M_p == paVar1) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(s.field_2._M_allocated_capacity._1_7_,s.field_2._M_local_buf[0]);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = s.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = s._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(s.field_2._M_allocated_capacity._1_7_,s.field_2._M_local_buf[0]);
    }
    __return_storage_ptr__->_M_string_length = s._M_string_length;
    s._M_string_length = 0;
    s.field_2._M_local_buf[0] = '\0';
    s._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_dispose();
  }
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return __return_storage_ptr__;
}

Assistant:

std::string ExpandFilePath(const std::string &_filepath, void *) {
  std::string filepath = _filepath;
  if (filepath.size() > 2048) {
    // file path too large.
    // TODO: Report warn.
    filepath.resize(2048);
  }

#ifdef _WIN32
  // Assume input `filepath` is encoded in UTF-8
  std::wstring wfilepath = UTF8ToWchar(filepath);
  DWORD wlen = ExpandEnvironmentStringsW(wfilepath.c_str(), nullptr, 0);
  wchar_t *wstr = new wchar_t[wlen];
  ExpandEnvironmentStringsW(wfilepath.c_str(), wstr, wlen);

  std::wstring ws(wstr);
  delete[] wstr;
  return WcharToUTF8(ws);

#else

#if defined(TINYUSDZ_BUILD_IOS) || defined(TARGET_OS_IPHONE) || \
    defined(TARGET_IPHONE_SIMULATOR) || defined(__ANDROID__) || \
    defined(__EMSCRIPTEN__) || defined(__OpenBSD__) || defined(__wasi__)
  // no expansion
  std::string s = filepath;
#else
  std::string s;
  wordexp_t p;

  if (filepath.empty()) {
    return "";
  }

  // Quote the string to keep any spaces in filepath intact.
  std::string quoted_path = "\"" + filepath + "\"";
  // char** w;
  // TODO: wordexp() is a awful API. Implement our own file path expansion
  // routine. Set NOCMD for security.
  int ret = wordexp(quoted_path.c_str(), &p, WRDE_NOCMD);
  if (ret) {
    // err
    s = filepath;
    return s;
  }

  // Use first element only.
  if (p.we_wordv) {
    s = std::string(p.we_wordv[0]);
    wordfree(&p);
  } else {
    s = filepath;
  }

#endif

  return s;
#endif
}